

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator * __thiscall
QMultiHash<QString,_QDBusConnectionPrivate::SignalHook>::detach
          (iterator *__return_storage_ptr__,
          QMultiHash<QString,_QDBusConnectionPrivate::SignalHook> *this,const_iterator it)

{
  Chain *pCVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  uVar5 = (uint)it.i.bucket;
  if (1 < (uint)(this->d->ref).atomic._q_value.super___atomic_base<int>._M_i) {
    uVar2 = it.i.bucket >> 7;
    uVar3 = uVar5 & 0x7f;
    lVar4 = 0;
    for (pCVar1 = *(Chain **)
                   ((it.i.d)->spans[uVar2].entries[(it.i.d)->spans[uVar2].offsets[uVar3]].storage.
                    data + 0x18); pCVar1 != *it.e; pCVar1 = pCVar1->next) {
      lVar4 = lVar4 + 1;
    }
    detach_helper(this);
    it.i.d = this->d;
    it.e = (Chain **)
           ((it.i.d)->spans[uVar2].entries[(it.i.d)->spans[uVar2].offsets[uVar3]].storage.data +
           0x18);
    for (; lVar4 != 0; lVar4 = lVar4 + -1) {
      it.e = (Chain **)((long)*it.e + 0xb8);
    }
  }
  (__return_storage_ptr__->i).d = it.i.d;
  (__return_storage_ptr__->i).bucket = it.i.bucket;
  __return_storage_ptr__->e = it.e;
  if ((it.i.d != (Data *)0x0) && (it.e == (Chain **)0x0)) {
    __return_storage_ptr__->e =
         (Chain **)
         ((it.i.d)->spans[it.i.bucket >> 7].entries
          [(it.i.d)->spans[it.i.bucket >> 7].offsets[uVar5 & 0x7f]].storage.data + 0x18);
  }
  return __return_storage_ptr__;
}

Assistant:

iterator detach(const_iterator it)
    {
        auto i = it.i;
        Chain **e = it.e;
        if (d->ref.isShared()) {
            // need to store iterator position before detaching
            qsizetype n = 0;
            Chain *entry = i.node()->value;
            while (entry != *it.e) {
                ++n;
                entry = entry->next;
            }
            Q_ASSERT(entry);
            detach_helper();

            i = d->detachedIterator(i);
            e = &i.node()->value;
            while (n) {
                e = &(*e)->next;
                --n;
            }
            Q_ASSERT(e && *e);
        }
        return iterator(i, e);
    }